

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

string * getTempDir_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"/tmp/","");
  return in_RDI;
}

Assistant:

std::string getTempDir()
{
#if defined(WIN32)
    TCHAR tempPath[MAX_PATH];
    if (GetTempPath(sizeof(tempPath), tempPath))
    {
        std::string thePath = tempPath;
        return thePath;
    }
    return getRootDir() + std::string("TEMP");
#else
    return std::string("/tmp/");
#endif
}